

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper_common.cpp
# Opt level: O3

void src_DestinationOut(uint32_t *dest,int length,uint32_t *src,uint32_t alpha)

{
  ulong uVar1;
  int iVar2;
  
  if (alpha == 0xff) {
    if (0 < length) {
      uVar1 = 0;
      do {
        dest[uVar1] = (dest[uVar1] & 0xff00ff) * (~src[uVar1] >> 0x18) >> 8 & 0xff00ff |
                      (dest[uVar1] >> 8 & 0xff00ff) * (~src[uVar1] >> 0x18) & 0xff00ff00;
        uVar1 = uVar1 + 1;
      } while ((uint)length != uVar1);
    }
  }
  else if (0 < length) {
    uVar1 = 0;
    do {
      iVar2 = (((~src[uVar1] >> 0x18) * alpha >> 8 & 0xff00ff) - alpha) + 0xff;
      dest[uVar1] = (dest[uVar1] & 0xff00ff) * iVar2 >> 8 & 0xff00ff |
                    (dest[uVar1] >> 8 & 0xff00ff) * iVar2 & 0xff00ff00;
      uVar1 = uVar1 + 1;
    } while ((uint)length != uVar1);
  }
  return;
}

Assistant:

static void src_DestinationOut(uint32_t *dest, int length, const uint32_t *src,
                               uint32_t alpha)
{
    if (alpha == 255) {
        for (int i = 0; i < length; ++i) {
            dest[i] = BYTE_MUL(dest[i], vAlpha(~src[i]));
        }
    } else {
        uint32_t cia = 255 - alpha;
        for (int i = 0; i < length; ++i) {
            uint32_t sia = BYTE_MUL(vAlpha(~src[i]), alpha) + cia;
            dest[i] = BYTE_MUL(dest[i], sia);
        }
    }
}